

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

string * __thiscall
flatbuffers::go::GoGenerator::NativeType_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  StructDef *struct_def;
  EnumDef *enum_def;
  bool bVar1;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Type local_78;
  string local_58;
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  GoGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (GoGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar(type->base_type);
  if (bVar1) {
    if (local_20->enum_def == (EnumDef *)0x0) {
      GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,local_20);
    }
    else {
      GetEnumTypeName_abi_cxx11_(__return_storage_ptr__,this,local_20->enum_def);
    }
  }
  else {
    bVar1 = IsString(local_20);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"string",&local_21);
      std::allocator<char>::~allocator(&local_21);
    }
    else {
      bVar1 = IsVector(local_20);
      if (bVar1) {
        Type::VectorType(&local_78,local_20);
        NativeType_abi_cxx11_(&local_58,this,&local_78);
        std::operator+(__return_storage_ptr__,"[]",&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
      else if (local_20->base_type == BASE_TYPE_STRUCT) {
        struct_def = local_20->struct_def;
        NativeName_abi_cxx11_(&local_b8,this,struct_def);
        WrapInNameSpaceAndTrack(&local_98,this,&struct_def->super_Definition,&local_b8);
        std::operator+(__return_storage_ptr__,"*",&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        if (local_20->base_type != BASE_TYPE_UNION) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                        ,0x5e5,"std::string flatbuffers::go::GoGenerator::NativeType(const Type &)")
          ;
        }
        enum_def = local_20->enum_def;
        NativeName_abi_cxx11_(&local_f8,this,enum_def);
        WrapInNameSpaceAndTrack(&local_d8,this,&enum_def->super_Definition,&local_f8);
        std::operator+(__return_storage_ptr__,"*",&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NativeType(const Type &type) {
    if (IsScalar(type.base_type)) {
      if (type.enum_def == nullptr) {
        return GenTypeBasic(type);
      } else {
        return GetEnumTypeName(*type.enum_def);
      }
    } else if (IsString(type)) {
      return "string";
    } else if (IsVector(type)) {
      return "[]" + NativeType(type.VectorType());
    } else if (type.base_type == BASE_TYPE_STRUCT) {
      return "*" + WrapInNameSpaceAndTrack(type.struct_def,
                                           NativeName(*type.struct_def));
    } else if (type.base_type == BASE_TYPE_UNION) {
      return "*" +
             WrapInNameSpaceAndTrack(type.enum_def, NativeName(*type.enum_def));
    }
    FLATBUFFERS_ASSERT(0);
    return std::string();
  }